

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_convolver_impl.cpp
# Opt level: O0

void __thiscall
ear::dsp::block_convolver_impl::BlockConvolver::BlockConvolver
          (BlockConvolver *this,shared_ptr<ear::dsp::block_convolver_impl::Context> *ctx,
          size_t num_blocks)

{
  element_type *peVar1;
  element_type *peVar2;
  size_type __n;
  ulong local_50;
  size_t i;
  shared_ptr<const_ear::dsp::block_convolver_impl::Filter> local_40 [2];
  size_t local_20;
  size_t num_blocks_local;
  shared_ptr<ear::dsp::block_convolver_impl::Context> *ctx_local;
  BlockConvolver *this_local;
  
  local_20 = num_blocks;
  num_blocks_local = (size_t)ctx;
  ctx_local = &this->ctx;
  std::shared_ptr<ear::dsp::block_convolver_impl::Context>::shared_ptr(&this->ctx,ctx);
  peVar1 = std::
           __shared_ptr_access<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)num_blocks_local);
  peVar2 = std::__shared_ptr_access<ear::FFTPlan<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ear::FFTPlan<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&peVar1->fft);
  (*peVar2->_vptr_FFTPlan[2])(&this->fft_work_buf);
  this->num_blocks = local_20;
  __n = local_20 + 1;
  std::shared_ptr<const_ear::dsp::block_convolver_impl::Filter>::shared_ptr(local_40,(nullptr_t)0x0)
  ;
  std::allocator<std::shared_ptr<const_ear::dsp::block_convolver_impl::Filter>_>::allocator
            ((allocator<std::shared_ptr<const_ear::dsp::block_convolver_impl::Filter>_> *)
             ((long)&i + 7));
  std::
  vector<std::shared_ptr<const_ear::dsp::block_convolver_impl::Filter>,_std::allocator<std::shared_ptr<const_ear::dsp::block_convolver_impl::Filter>_>_>
  ::vector(&this->filter_queue,__n,local_40,
           (allocator<std::shared_ptr<const_ear::dsp::block_convolver_impl::Filter>_> *)
           ((long)&i + 7));
  std::allocator<std::shared_ptr<const_ear::dsp::block_convolver_impl::Filter>_>::~allocator
            ((allocator<std::shared_ptr<const_ear::dsp::block_convolver_impl::Filter>_> *)
             ((long)&i + 7));
  std::shared_ptr<const_ear::dsp::block_convolver_impl::Filter>::~shared_ptr(local_40);
  this->filter_ofs = 0;
  std::
  vector<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,_-1,_1,_0,_-1,_1>_>,_std::allocator<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,_-1,_1,_0,_-1,_1>_>_>_>
  ::vector(&this->spectra_queue_old);
  std::
  vector<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,_-1,_1,_0,_-1,_1>_>,_std::allocator<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,_-1,_1,_0,_-1,_1>_>_>_>
  ::vector(&this->spectra_queue_new);
  this->spectra_ofs = 0;
  peVar1 = std::
           __shared_ptr_access<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)num_blocks_local);
  ZeroTrack<Eigen::Matrix<float,-1,1,0,-1,1>>::ZeroTrack<unsigned_long_const&>
            ((ZeroTrack<Eigen::Matrix<float,_1,1,0,_1,1>> *)&this->last_tail,&peVar1->block_size);
  peVar1 = std::
           __shared_ptr_access<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)num_blocks_local);
  ZeroTrack<Eigen::Matrix<float,-1,1,0,-1,1>>::ZeroTrack<unsigned_long_const&>
            ((ZeroTrack<Eigen::Matrix<float,_1,1,0,_1,1>> *)&this->current_td_old,&peVar1->td_size);
  peVar1 = std::
           __shared_ptr_access<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)num_blocks_local);
  ZeroTrack<Eigen::Matrix<float,-1,1,0,-1,1>>::ZeroTrack<unsigned_long_const&>
            ((ZeroTrack<Eigen::Matrix<float,_1,1,0,_1,1>> *)&this->current_td_new,&peVar1->td_size);
  peVar1 = std::
           __shared_ptr_access<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)num_blocks_local);
  ZeroTrack<Eigen::Matrix<std::complex<float>,-1,1,0,-1,1>>::ZeroTrack<unsigned_long_const&>
            ((ZeroTrack<Eigen::Matrix<std::complex<float>,_1,1,0,_1,1>> *)&this->multiply_out,
             &peVar1->fd_size);
  peVar1 = std::
           __shared_ptr_access<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)num_blocks_local);
  ZeroTrack<Eigen::Matrix<float,-1,1,0,-1,1>>::ZeroTrack<unsigned_long_const&>
            ((ZeroTrack<Eigen::Matrix<float,_1,1,0,_1,1>> *)&this->out_td,&peVar1->td_size);
  for (local_50 = 0; local_50 < local_20; local_50 = local_50 + 1) {
    peVar1 = std::
             __shared_ptr_access<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)num_blocks_local);
    std::
    vector<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,-1,1,0,-1,1>>,std::allocator<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,-1,1,0,-1,1>>>>
    ::emplace_back<unsigned_long_const&>
              ((vector<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,_1,1,0,_1,1>>,std::allocator<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,_1,1,0,_1,1>>>>
                *)&this->spectra_queue_old,&peVar1->fd_size);
    peVar1 = std::
             __shared_ptr_access<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)num_blocks_local);
    std::
    vector<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,-1,1,0,-1,1>>,std::allocator<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,-1,1,0,-1,1>>>>
    ::emplace_back<unsigned_long_const&>
              ((vector<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,_1,1,0,_1,1>>,std::allocator<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,_1,1,0,_1,1>>>>
                *)&this->spectra_queue_new,&peVar1->fd_size);
  }
  return;
}

Assistant:

BlockConvolver::BlockConvolver(const std::shared_ptr<Context> &ctx,
                                     size_t num_blocks)
          : ctx(ctx),
            fft_work_buf(ctx->fft->alloc_workbuf()),
            num_blocks(num_blocks),
            filter_queue(num_blocks + 1, NULL),
            filter_ofs(0),
            spectra_ofs(0),
            last_tail(ctx->block_size),
            current_td_old(ctx->td_size),
            current_td_new(ctx->td_size),
            multiply_out(ctx->fd_size),
            out_td(ctx->td_size) {
        for (size_t i = 0; i < num_blocks; i++) {
          spectra_queue_old.emplace_back(ctx->fd_size);
          spectra_queue_new.emplace_back(ctx->fd_size);
        }
      }